

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPLinearClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPLinearClause *this)

{
  OpenMPLinearClauseModifier OVar1;
  bool bVar2;
  string clause_string;
  allocator<char> local_60 [8];
  ulong local_58;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"linear ",local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"(",(allocator<char> *)&local_40);
  OVar1 = this->modifier;
  if (OVar1 < OMPC_LINEAR_MODIFIER_user) {
    std::__cxx11::string::append((char *)local_60);
  }
  if (1 < local_58) {
    std::__cxx11::string::append((char *)local_60);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_40,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (OVar1 < OMPC_LINEAR_MODIFIER_user) {
    std::__cxx11::string::append((char *)local_60);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->user_defined_step);
  bVar2 = std::operator!=(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2) {
    std::__cxx11::string::append((char *)local_60);
    std::__cxx11::string::string((string *)&local_40,(string *)&this->user_defined_step);
    std::__cxx11::string::append((string *)local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPLinearClause::toString() {

    std::string result = "linear ";
    std::string clause_string = "(";
    bool flag = false;
    OpenMPLinearClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_LINEAR_MODIFIER_val:
            clause_string += "val";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_ref:
            clause_string += "ref";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_uval:
            clause_string += "uval";
            flag = true;
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += "( ";
    };
    clause_string += this->expressionToString();
    if (flag == true) {
        clause_string += ") ";
    };
    if(this->getUserDefinedStep() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedStep();
    }
    clause_string += ") ";
    result += clause_string;
    return result;
}